

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess_test.cc
# Opt level: O0

void __thiscall SubprocessTestSetWithSingle::Run(SubprocessTestSetWithSingle *this)

{
  undefined *__s;
  Test *pTVar1;
  bool bVar2;
  ExitStatus EVar3;
  Subprocess *pSVar4;
  string *__rhs;
  size_type sVar5;
  allocator<char> local_39;
  string local_38;
  Subprocess *local_18;
  Subprocess *subproc;
  SubprocessTestSetWithSingle *this_local;
  
  __s = (anonymous_namespace)::kSimpleCommand;
  subproc = (Subprocess *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,__s,&local_39);
  pSVar4 = SubprocessSet::Add(&(this->super_SubprocessTest).subprocs_,&local_38,false);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  local_18 = pSVar4;
  bVar2 = testing::Test::Check
                    (g_current_test,pSVar4 != (Subprocess *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/subprocess_test.cc"
                     ,0xa8,"(Subprocess *) 0 != subproc");
  if (bVar2) {
    while (bVar2 = Subprocess::Done(local_18), pTVar1 = g_current_test, ((bVar2 ^ 0xffU) & 1) != 0)
    {
      SubprocessSet::DoWork(&(this->super_SubprocessTest).subprocs_);
    }
    EVar3 = Subprocess::Finish(local_18);
    bVar2 = testing::Test::Check
                      (pTVar1,EVar3 == ExitSuccess,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/subprocess_test.cc"
                       ,0xad,"ExitSuccess == subproc->Finish()");
    pTVar1 = g_current_test;
    if (bVar2) {
      __rhs = Subprocess::GetOutput_abi_cxx11_(local_18);
      bVar2 = std::operator!=("",__rhs);
      bVar2 = testing::Test::Check
                        (pTVar1,bVar2,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/subprocess_test.cc"
                         ,0xae,"\"\" != subproc->GetOutput()");
      pTVar1 = g_current_test;
      if (bVar2) {
        sVar5 = std::queue<Subprocess_*,_std::deque<Subprocess_*,_std::allocator<Subprocess_*>_>_>::
                size(&(this->super_SubprocessTest).subprocs_.finished_);
        bVar2 = testing::Test::Check
                          (pTVar1,sVar5 == 1,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/subprocess_test.cc"
                           ,0xb0,"1u == subprocs_.finished_.size()");
        if (!bVar2) {
          testing::Test::AddAssertionFailure(g_current_test);
        }
      }
      else {
        testing::Test::AddAssertionFailure(g_current_test);
      }
    }
    else {
      testing::Test::AddAssertionFailure(g_current_test);
    }
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  return;
}

Assistant:

TEST_F(SubprocessTest, SetWithSingle) {
  Subprocess* subproc = subprocs_.Add(kSimpleCommand);
  ASSERT_NE((Subprocess *) 0, subproc);

  while (!subproc->Done()) {
    subprocs_.DoWork();
  }
  ASSERT_EQ(ExitSuccess, subproc->Finish());
  ASSERT_NE("", subproc->GetOutput());

  ASSERT_EQ(1u, subprocs_.finished_.size());
}